

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O0

void Rsb_DecPrintTable(word *pCexes,int nGs,int nGsAll,Vec_Int_t *vTries)

{
  ulong uVar1;
  int iVar2;
  undefined8 uVar3;
  int local_7c;
  int iStart;
  int Cand;
  int c;
  int i;
  int nCands;
  int pCands [16];
  Vec_Int_t *vTries_local;
  int nGsAll_local;
  int nGs_local;
  word *pCexes_local;
  
  local_7c = 0;
  iVar2 = Vec_IntSize(vTries);
  if (iVar2 != 0) {
    for (Cand = 0; Cand < 4; Cand = Cand + 1) {
      printf("    ");
    }
    printf("  ");
    for (Cand = 0; Cand < nGs; Cand = Cand + 1) {
      uVar1 = (ulong)(uint)((int)((long)Cand % 100) >> 0x1f) << 0x20 |
              (long)Cand % 100 & 0xffffffffU;
      printf("%d",(long)uVar1 / 10 & 0xffffffff,(long)uVar1 % 10 & 0xffffffff);
    }
    printf("|");
    for (; Cand < nGsAll; Cand = Cand + 1) {
      uVar1 = (ulong)(uint)((int)((long)Cand % 100) >> 0x1f) << 0x20 |
              (long)Cand % 100 & 0xffffffffU;
      printf("%d",(long)uVar1 / 10 & 0xffffffff,(long)uVar1 % 10 & 0xffffffff);
    }
    printf("\n");
    for (Cand = 0; Cand < 4; Cand = Cand + 1) {
      printf("    ");
    }
    printf("  ");
    for (Cand = 0; Cand < nGs; Cand = Cand + 1) {
      printf("%d",(long)Cand % 10 & 0xffffffff);
    }
    printf("|");
    for (; Cand < nGsAll; Cand = Cand + 1) {
      printf("%d",(long)Cand % 10 & 0xffffffff);
    }
    printf("\n");
    printf("\n");
    iStart = 0;
    while (iVar2 = Vec_IntSize(vTries), local_7c < iVar2) {
      for (Cand = 0; Cand < 4; Cand = Cand + 1) {
        (&i)[Cand] = -1;
      }
      c = 0;
      for (Cand = local_7c; iVar2 = Vec_IntSize(vTries), Cand < iVar2; Cand = Cand + 1) {
        iVar2 = Vec_IntEntry(vTries,Cand);
        if (iVar2 == -1) {
          local_7c = Cand + 1;
          break;
        }
        (&i)[c] = iVar2;
        c = c + 1;
      }
      if (4 < c) {
        __assert_fail("nCands <= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/rsb/rsbDec6.c"
                      ,0xef,"void Rsb_DecPrintTable(word *, int, int, Vec_Int_t *)");
      }
      for (Cand = 0; Cand < 4; Cand = Cand + 1) {
        if ((&i)[Cand] < 0) {
          printf("    ");
        }
        else {
          printf("%4d",(ulong)(uint)(&i)[Cand]);
        }
      }
      printf("  ");
      for (Cand = 0; Cand < nGs; Cand = Cand + 1) {
        iVar2 = Abc_TtGetBit(pCexes + Cand,iStart);
        uVar3 = 0x2b;
        if (iVar2 != 0) {
          uVar3 = 0x2e;
        }
        printf("%c",uVar3);
      }
      printf("|");
      for (; Cand < nGsAll; Cand = Cand + 1) {
        iVar2 = Abc_TtGetBit(pCexes + Cand,iStart);
        uVar3 = 0x2b;
        if (iVar2 != 0) {
          uVar3 = 0x2e;
        }
        printf("%c",uVar3);
      }
      printf("  %3d\n",(ulong)(uint)iStart);
      iStart = iStart + 1;
    }
    printf("\n");
    for (Cand = 0; Cand < 4; Cand = Cand + 1) {
      printf("    ");
    }
    printf("  ");
    for (Cand = 0; Cand < nGs; Cand = Cand + 1) {
      iVar2 = Abc_TtCountOnes(pCexes[Cand]);
      printf("%d",(long)iVar2 / 10 & 0xffffffff,(long)iVar2 % 10 & 0xffffffff);
    }
    printf("|");
    for (; Cand < nGsAll; Cand = Cand + 1) {
      iVar2 = Abc_TtCountOnes(pCexes[Cand]);
      printf("%d",(long)iVar2 / 10 & 0xffffffff,(long)iVar2 % 10 & 0xffffffff);
    }
    printf("\n");
    for (Cand = 0; Cand < 4; Cand = Cand + 1) {
      printf("    ");
    }
    printf("  ");
    for (Cand = 0; Cand < nGs; Cand = Cand + 1) {
      iVar2 = Abc_TtCountOnes(pCexes[Cand]);
      printf("%d",(long)iVar2 % 10 & 0xffffffff);
    }
    printf("|");
    for (; Cand < nGsAll; Cand = Cand + 1) {
      iVar2 = Abc_TtCountOnes(pCexes[Cand]);
      printf("%d",(long)iVar2 % 10 & 0xffffffff);
    }
    printf("\n");
    printf("\n");
  }
  return;
}

Assistant:

void Rsb_DecPrintTable( word * pCexes, int nGs, int nGsAll, Vec_Int_t * vTries ) 
{
    int pCands[16], nCands;
    int i, c, Cand, iStart = 0;
    if ( Vec_IntSize(vTries) == 0 )
        return;

//    printf( "\n" );
    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", (i % 100) / 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", (i % 100) / 10 );
    printf( "\n" );

    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", i % 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", i % 10 );
    printf( "\n" );
    printf( "\n" );

    for ( c = 0; iStart < Vec_IntSize(vTries); c++ )
    {
        // collect candidates
        for ( i = 0; i < 4; i++ )
            pCands[i] = -1;
        nCands = 0;
        Vec_IntForEachEntryStart( vTries, Cand, i, iStart )
            if ( Cand == -1 )
            {
                iStart = i + 1;
                break;
            }
            else
                pCands[nCands++] = Cand;
        assert( nCands <= 4 );
        // print them
        for ( i = 0; i < 4; i++ )
            if ( pCands[i] >= 0 )
                printf( "%4d", pCands[i] );
            else
                printf( "    " );
        // print the bit-string
        printf( "  " );
        for ( i = 0; i < nGs; i++ )
            printf( "%c", Abc_TtGetBit( pCexes + i, c ) ? '.' : '+' );
        printf( "|" );
        for ( ; i < nGsAll; i++ )
            printf( "%c", Abc_TtGetBit( pCexes + i, c ) ? '.' : '+' );
        printf( "  %3d\n", c );
    }
    printf( "\n" );

    // write the number of ones
    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) / 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) / 10 );
    printf( "\n" );

    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) % 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) % 10 );
    printf( "\n" );
    printf( "\n" );
}